

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::RobustBufferAccessBehavior::StorageBufferTest::iterate(StorageBufferTest *this)

{
  string *compute_shader;
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  undefined8 uVar5;
  TestContext *pTVar6;
  GLfloat *buffer_data;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  string *local_d8;
  string *cs;
  Program program;
  undefined1 local_50 [8];
  Buffer source_buffer;
  Buffer destination_buffer;
  bool test_result;
  Functions *gl;
  StorageBufferTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  destination_buffer._23_1_ = 1;
  while (this->m_test_case != LAST) {
    RobustBufferAccessBehavior::Buffer::Buffer
              ((Buffer *)&source_buffer.m_target,(this->super_TestCase).m_context);
    RobustBufferAccessBehavior::Buffer::Buffer((Buffer *)local_50,(this->super_TestCase).m_context);
    RobustBufferAccessBehavior::Program::Program((Program *)&cs,(this->super_TestCase).m_context);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(&local_f8);
    local_d8 = &local_f8;
    RobustBufferAccessBehavior::Buffer::InitData
              ((Buffer *)&source_buffer.m_target,0x90d2,0x88ea,0x10,iterate::destination_data);
    RobustBufferAccessBehavior::Buffer::InitData
              ((Buffer *)local_50,0x90d2,0x88ea,0x10,iterate::source_data);
    RobustBufferAccessBehavior::Buffer::BindBase((Buffer *)&source_buffer.m_target,0);
    RobustBufferAccessBehavior::Buffer::BindBase((Buffer *)local_50,1);
    compute_shader = local_d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"",&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"",&local_169);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"",&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"",(allocator<char> *)((long)&buffer_data + 7));
    RobustBufferAccessBehavior::Program::Init
              ((Program *)&cs,compute_shader,&local_118,&local_140,&local_168,&local_190,&local_1b8)
    ;
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&buffer_data + 7));
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    RobustBufferAccessBehavior::Program::Use((Program *)&cs);
    (**(code **)(lVar4 + 0x528))(1,1);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"DispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xd10);
    (**(code **)(lVar4 + 0xdb8))(0xffffffff);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"MemoryBarrier",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xd14);
    RobustBufferAccessBehavior::Buffer::Bind((Buffer *)&source_buffer.m_target);
    uVar5 = (**(code **)(lVar4 + 0xd00))(0x90d2,0,0x10,1);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"MapBufferRange",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xd1a);
    iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this,uVar5);
    destination_buffer._23_1_ = (byte)iVar1 & 1;
    (**(code **)(lVar4 + 0x1670))(0x90d2);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"UnmapBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xd1f);
    this->m_test_case = this->m_test_case + SOURCE_INVALID;
    std::__cxx11::string::~string((string *)&local_f8);
    RobustBufferAccessBehavior::Program::~Program((Program *)&cs);
    RobustBufferAccessBehavior::Buffer::~Buffer((Buffer *)local_50);
    RobustBufferAccessBehavior::Buffer::~Buffer((Buffer *)&source_buffer.m_target);
  }
  if (destination_buffer._23_1_ == '\x01') {
    pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar6,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar6,QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult StorageBufferTest::iterate()
{
	static const GLfloat destination_data[4] = { 1.0f, 1.0f, 1.0f, 1.0f };
	static const GLfloat source_data[4]		 = { 2.0f, 3.0f, 4.0f, 5.0f };

	/* GL entry points */
	const Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result indicator */
	bool test_result = true;

	/* Iterate over all cases */
	while (LAST != m_test_case)
	{
		/* Test case objects */
		Buffer  destination_buffer(m_context);
		Buffer  source_buffer(m_context);
		Program program(m_context);

		/* Compute Shader */
		const std::string& cs = getComputeShader();

		/* Buffers initialization */
		destination_buffer.InitData(GL_SHADER_STORAGE_BUFFER, GL_DYNAMIC_COPY, sizeof(destination_data),
									destination_data);
		source_buffer.InitData(GL_SHADER_STORAGE_BUFFER, GL_DYNAMIC_COPY, sizeof(source_data), source_data);

		destination_buffer.BindBase(0);
		source_buffer.BindBase(1);

		/* Shaders initialization */
		program.Init(cs, "" /* fs */, "" /* gs */, "" /* tcs */, "" /* tes */, "" /* vs */);
		program.Use();

		/* Dispatch compute */
		gl.dispatchCompute(1 /* x */, 1 /* y */, 1 /* z */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

		/* Set memory barrier */
		gl.memoryBarrier(GL_ALL_BARRIER_BITS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

		/* Verify results */
		destination_buffer.Bind();
		GLfloat* buffer_data =
			(GLfloat*)gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(destination_data), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MapBufferRange");

		test_result = verifyResults(buffer_data);

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

		/* Increment */
		m_test_case = (VERSION)((GLuint)m_test_case + 1);
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}